

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O0

int Cudd_bddLeq(DdManager *dd,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *local_98;
  bool local_75;
  uint res;
  uint topg;
  uint topf;
  DdNode *gvn;
  DdNode *gv;
  DdNode *fvn;
  DdNode *fv;
  DdNode *F;
  DdNode *tmp;
  DdNode *zero;
  DdNode *one;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f == g) {
    dd_local._4_4_ = 1;
  }
  else {
    if (((ulong)g & 1) == 0) {
      one = g;
      g_local = f;
      if ((((ulong)f & 1) != 0) &&
         ((*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)g & 1)) <
          (*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)f & 1)))) {
        one = (DdNode *)((ulong)f ^ 1);
        g_local = (DdNode *)((ulong)g ^ 1);
      }
    }
    else {
      if (((ulong)f & 1) == 0) {
        return 0;
      }
      one = (DdNode *)((ulong)f ^ 1);
      g_local = (DdNode *)((ulong)g ^ 1);
    }
    pDVar1 = dd->one;
    if (one == pDVar1) {
      dd_local._4_4_ = 1;
    }
    else if (g_local == pDVar1) {
      dd_local._4_4_ = 0;
    }
    else if ((DdNode *)((ulong)g_local ^ 1) == one) {
      dd_local._4_4_ = 0;
    }
    else {
      local_98 = (DdNode *)((ulong)pDVar1 ^ 1);
      if (g_local == local_98) {
        dd_local._4_4_ = 1;
      }
      else {
        pDVar3 = cuddCacheLookup2(dd,Cudd_bddLeq,g_local,one);
        if (pDVar3 == (DdNode *)0x0) {
          pDVar3 = (DdNode *)((ulong)g_local & 0xfffffffffffffffe);
          if ((uint)dd->perm[one->index] < (uint)dd->perm[pDVar3->index]) {
            gv = g_local;
            fvn = g_local;
          }
          else {
            fvn = (pDVar3->type).kids.T;
            gv = (pDVar3->type).kids.E;
            if (g_local != pDVar3) {
              fvn = (DdNode *)((ulong)fvn ^ 1);
              gv = (DdNode *)((ulong)gv ^ 1);
            }
          }
          if ((uint)dd->perm[pDVar3->index] < (uint)dd->perm[one->index]) {
            _topg = one;
            gvn = one;
          }
          else {
            gvn = (one->type).kids.T;
            _topg = (one->type).kids.E;
          }
          iVar2 = Cudd_bddLeq(dd,gv,_topg);
          local_75 = false;
          if (iVar2 != 0) {
            iVar2 = Cudd_bddLeq(dd,fvn,gvn);
            local_75 = iVar2 != 0;
          }
          dd_local._4_4_ = (uint)local_75;
          if (dd_local._4_4_ != 0) {
            local_98 = pDVar1;
          }
          cuddCacheInsert2(dd,Cudd_bddLeq,g_local,one,local_98);
        }
        else {
          dd_local._4_4_ = (uint)(pDVar3 == pDVar1);
        }
      }
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_bddLeq(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *one, *zero, *tmp, *F, *fv, *fvn, *gv, *gvn;
    unsigned int topf, topg, res;

    statLine(dd);
    /* Terminal cases and normalization. */
    if (f == g) return(1);

    if (Cudd_IsComplement(g)) {
        /* Special case: if f is regular and g is complemented,
        ** f(1,...,1) = 1 > 0 = g(1,...,1).
        */
        if (!Cudd_IsComplement(f)) return(0);
        /* Both are complemented: Swap and complement because
        ** f <= g <=> g' <= f' and we want the second argument to be regular.
        */
        tmp = g;
        g = Cudd_Not(f);
        f = Cudd_Not(tmp);
    } else if (Cudd_IsComplement(f) && cuddF2L(g) < cuddF2L(f)) {
        tmp = g;
        g = Cudd_Not(f);
        f = Cudd_Not(tmp);
    }

    /* Now g is regular and, if f is not regular, f < g. */
    one = DD_ONE(dd);
    if (g == one) return(1);    /* no need to test against zero */
    if (f == one) return(0);    /* since at this point g != one */
    if (Cudd_Not(f) == g) return(0); /* because neither is constant */
    zero = Cudd_Not(one);
    if (f == zero) return(1);

    /* Here neither f nor g is constant. */

    /* Check cache. */
    tmp = cuddCacheLookup2(dd,(DD_CTFP)Cudd_bddLeq,f,g);
    if (tmp != NULL) {
        return(tmp == one);
    }

    /* Compute cofactors. */
    F = Cudd_Regular(f);
    topf = dd->perm[F->index];
    topg = dd->perm[g->index];
    if (topf <= topg) {
        fv = cuddT(F); fvn = cuddE(F);
        if (f != F) {
            fv = Cudd_Not(fv);
            fvn = Cudd_Not(fvn);
        }
    } else {
        fv = fvn = f;
    }
    if (topg <= topf) {
        gv = cuddT(g); gvn = cuddE(g);
    } else {
        gv = gvn = g;
    }

    /* Recursive calls. Since we want to maximize the probability of
    ** the special case f(1,...,1) > g(1,...,1), we consider the negative
    ** cofactors first. Indeed, the complementation parity of the positive
    ** cofactors is the same as the one of the parent functions.
    */
    res = Cudd_bddLeq(dd,fvn,gvn) && Cudd_bddLeq(dd,fv,gv);

    /* Store result in cache and return. */
    cuddCacheInsert2(dd,(DD_CTFP)Cudd_bddLeq,f,g,(res ? one : zero));
    return(res);

}